

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O1

void __thiscall
AnonADIOSFile::AnonADIOSFile
          (AnonADIOSFile *this,string *FileName,RemoteFileMode mode,bool RowMajorArrays)

{
  pointer pcVar1;
  IO *pIVar2;
  Engine *pEVar3;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this->m_io = (IO *)0x0;
  this->m_engine = (Engine *)0x0;
  this->currentStep = -1;
  (this->m_IOname)._M_dataplus._M_p = (pointer)&(this->m_IOname).field_2;
  (this->m_IOname)._M_string_length = 0;
  (this->m_IOname).field_2._M_local_buf[0] = '\0';
  (this->m_FileName)._M_dataplus._M_p = (pointer)&(this->m_FileName).field_2;
  (this->m_FileName)._M_string_length = 0;
  (this->m_FileName).field_2._M_local_buf[0] = '\0';
  this->m_BytesSent = 0;
  this->m_OperationCount = 0;
  this->m_mode = RemoteOpen;
  std::__cxx11::string::_M_assign((string *)&this->m_FileName);
  lf_random_string_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&this->m_IOname,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  pcVar1 = (this->m_IOname)._M_dataplus._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + (this->m_IOname)._M_string_length);
  pIVar2 = (IO *)adios2::core::ADIOS::DeclareIO(adios,local_70,!RowMajorArrays);
  this->m_io = pIVar2;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  this->m_mode = mode;
  pEVar3 = (Engine *)adios2::core::IO::Open((string *)this->m_io,(Mode)FileName);
  this->m_engine = pEVar3;
  this->m_ID = *(int64_t *)(this->m_IOname)._M_dataplus._M_p;
  return;
}

Assistant:

AnonADIOSFile(std::string FileName, EVPathRemoteCommon::RemoteFileMode mode,
                  bool RowMajorArrays)
    {
        Mode adios_read_mode = adios2::Mode::Read;
        m_FileName = FileName;
        m_IOname = lf_random_string();
        ArrayOrdering ArrayOrder =
            RowMajorArrays ? ArrayOrdering::RowMajor : ArrayOrdering::ColumnMajor;
        m_io = &adios.DeclareIO(m_IOname, ArrayOrder);
        m_mode = mode;
        if (m_mode == RemoteOpenRandomAccess)
            adios_read_mode = adios2::Mode::ReadRandomAccess;
        m_engine = &m_io->Open(FileName, adios_read_mode);
        memcpy(&m_ID, m_IOname.c_str(), sizeof(m_ID));
    }